

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereInScanEst(Parse *pParse,WhereLoopBuilder *pBuilder,ExprList *pList,tRowcnt *pnRow)

{
  short sVar1;
  char cVar2;
  Expr **ppEVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  ExprList_item *pEVar9;
  tRowcnt nEst;
  tRowcnt local_48;
  int local_44;
  tRowcnt *local_40;
  Parse *local_38;
  
  sVar1 = *((pBuilder->pNew->u).btree.pIndex)->aiRowLogEst;
  iVar4 = (int)sVar1 / 10;
  uVar6 = sVar1 + (short)iVar4 * -10;
  uVar5 = 0;
  lVar7 = 0;
  if (uVar6 != 0) {
    lVar7 = (long)(short)uVar6 + -1;
  }
  if (4 < uVar6) {
    lVar7 = (long)(short)uVar6 + -2;
  }
  cVar2 = (char)iVar4;
  uVar8 = lVar7 + 8U >> (3U - cVar2 & 0x3f);
  if (0x1d < sVar1) {
    uVar8 = lVar7 + 8U << (cVar2 - 3U & 0x3f);
  }
  local_44 = pBuilder->nRecValid;
  pEVar9 = pList->a;
  lVar7 = -1;
  local_40 = pnRow;
  local_38 = pParse;
  do {
    lVar7 = lVar7 + 1;
    local_48 = (tRowcnt)uVar8;
    if (pList->nExpr <= lVar7) {
      if ((long)(ulong)uVar5 <= (long)uVar8) {
        local_48 = uVar5;
      }
      *local_40 = local_48;
      return 0;
    }
    ppEVar3 = &pEVar9->pExpr;
    pEVar9 = pEVar9 + 1;
    iVar4 = whereEqualScanEst(local_38,pBuilder,*ppEVar3,&local_48);
    uVar5 = uVar5 + local_48;
    pBuilder->nRecValid = local_44;
  } while (iVar4 == 0);
  return iVar4;
}

Assistant:

static int whereInScanEst(
  Parse *pParse,       /* Parsing & code generating context */
  WhereLoopBuilder *pBuilder,
  ExprList *pList,     /* The value list on the RHS of "x IN (v1,v2,v3,...)" */
  tRowcnt *pnRow       /* Write the revised row estimate here */
){
  Index *p = pBuilder->pNew->u.btree.pIndex;
  i64 nRow0 = sqlite3LogEstToInt(p->aiRowLogEst[0]);
  int nRecValid = pBuilder->nRecValid;
  int rc = SQLITE_OK;     /* Subfunction return code */
  tRowcnt nEst;           /* Number of rows for a single term */
  tRowcnt nRowEst = 0;    /* New estimate of the number of rows */
  int i;                  /* Loop counter */

  assert( p->aSample!=0 );
  for(i=0; rc==SQLITE_OK && i<pList->nExpr; i++){
    nEst = nRow0;
    rc = whereEqualScanEst(pParse, pBuilder, pList->a[i].pExpr, &nEst);
    nRowEst += nEst;
    pBuilder->nRecValid = nRecValid;
  }

  if( rc==SQLITE_OK ){
    if( nRowEst > nRow0 ) nRowEst = nRow0;
    *pnRow = nRowEst;
    WHERETRACE(0x10,("IN row estimate: est=%d\n", nRowEst));
  }
  assert( pBuilder->nRecValid==nRecValid );
  return rc;
}